

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O3

string * format_system_error_abi_cxx11_
                   (string *__return_storage_ptr__,int error_code,StringRef message)

{
  undefined **ppuVar1;
  undefined **ppuVar2;
  undefined4 in_register_00000034;
  size_t in_R8;
  StringRef message_00;
  MemoryWriter out;
  undefined **local_250;
  undefined ***local_248;
  undefined **local_240;
  undefined1 *local_238;
  undefined8 local_230;
  ulong local_228;
  undefined1 local_220 [504];
  
  message_00.data_ = (char *)message.size_;
  local_248 = &local_240;
  local_250 = &PTR__BasicMemoryWriter_002ee180;
  local_230 = 0;
  local_228 = 500;
  local_240 = &PTR_grow_002ee1c8;
  message_00.size_ = in_R8;
  local_238 = local_220;
  fmt::internal::format_system_error
            ((internal *)&local_250,(Writer *)CONCAT44(in_register_00000034,error_code),
             (int)message.data_,message_00);
  ppuVar1 = local_248[1];
  ppuVar2 = local_248[2];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,ppuVar1,(long)ppuVar2 + (long)ppuVar1);
  local_250 = &PTR__BasicMemoryWriter_002ee180;
  local_240 = &PTR_grow_002ee1c8;
  if (local_238 != local_220) {
    operator_delete(local_238,local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_system_error(int error_code, fmt::StringRef message) {
  fmt::MemoryWriter out;
  fmt::internal::format_system_error(out, error_code, message);
  return out.str();
}